

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O2

void __thiscall
Wasm::WasmBytecodeGenerator::GenerateFunction::AutoCleanupGeneratorState::~AutoCleanupGeneratorState
          (AutoCleanupGeneratorState *this)

{
  bool bVar1;
  uint sourceContextId;
  LocalFunctionId functionId;
  WasmBinaryReader *pWVar2;
  
  if (this->gen != (WasmBytecodeGenerator *)0x0) {
    sourceContextId =
         Js::FunctionProxy::GetSourceContextId((FunctionProxy *)(this->gen->m_funcInfo->m_body).ptr)
    ;
    functionId = Js::FunctionProxy::GetLocalFunctionId
                           ((FunctionProxy *)(this->gen->m_funcInfo->m_body).ptr);
    bVar1 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_01453738,WasmBytecodePhase,sourceContextId,functionId);
    if (bVar1) {
      Output::Print(L"\nHad Compilation error!");
      Output::Print(L"\n");
      Output::Flush();
    }
    pWVar2 = (WasmBinaryReader *)(this->gen->m_funcInfo->m_customReader).ptr;
    if (pWVar2 == (WasmBinaryReader *)0x0) {
      pWVar2 = (this->gen->m_module->m_reader).ptr;
    }
    (*(pWVar2->super_WasmReaderBase)._vptr_WasmReaderBase[3])();
    (*this->gen->m_originalWriter->_vptr_IWasmByteCodeWriter[3])();
  }
  return;
}

Assistant:

~AutoCleanupGeneratorState()
        {
            if (gen)
            {
                TRACE_WASM(PHASE_TRACE(Js::WasmBytecodePhase, gen->GetFunctionBody()), _u("\nHad Compilation error!"));
                gen->GetReader()->FunctionEnd();
                gen->m_originalWriter->Reset();
            }
        }